

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,IteratorFlags flags)

{
  QDirListingPrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry QStack_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDirListingPrivate *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(this_00);
  this->d = this_00;
  QFileSystemEntry::QFileSystemEntry(&QStack_68,path);
  QFileSystemEntry::operator=(&(this->d->initialEntryInfo).entry,&QStack_68);
  QFileSystemEntry::~QFileSystemEntry(&QStack_68);
  QArrayDataPointer<QString>::operator=(&(this->d->nameFilters).d,&nameFilters->d);
  (this->d->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
            super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  QDirListingPrivate::init(this->d,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, IteratorFlags flags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->iteratorFlags = flags;
    d->init();
}